

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O1

int ddGroupMove(DdManager *table,int x,int y,Move **moves)

{
  Move *pMVar1;
  Move *pMVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  DdNode *pDVar8;
  int iVar9;
  int iVar10;
  DdHalfWord x_00;
  int iVar11;
  DdHalfWord y_00;
  DdHalfWord x_01;
  int iVar12;
  bool bVar13;
  
  uVar7 = table->subtables[x].next;
  uVar6 = y;
  do {
    uVar5 = uVar6;
    uVar6 = table->subtables[(int)uVar5].next;
  } while (uVar5 < uVar6);
  iVar9 = x - uVar7;
  iVar11 = uVar5 - y;
  if (iVar11 < 0) {
    x_00 = 0xffffffff;
    y_00 = 0xffffffff;
  }
  else {
    iVar10 = x - uVar7;
    y_00 = 0xffffffff;
    x_00 = 0xffffffff;
    x_01 = y;
    iVar3 = 1;
    do {
      iVar12 = iVar10 + 1;
      if (-1 < iVar9) {
        do {
          x_00 = x;
          y_00 = x_01;
          iVar4 = cuddSwapInPlace(table,x_00,y_00);
          if (iVar4 == 0) goto LAB_009252ac;
          x = cuddNextLow(table,x_00);
          iVar12 = iVar12 + -1;
          x_01 = x_00;
        } while (iVar12 != 0);
      }
      x_01 = iVar3 + y;
      x = cuddNextLow(table,x_01);
      bVar13 = iVar3 != (uVar5 - y) + 1;
      iVar3 = iVar3 + 1;
    } while (bVar13);
  }
  uVar6 = uVar7;
  if (0 < iVar11) {
    do {
      uVar5 = cuddNextHigh(table,uVar6);
      table->subtables[(int)uVar6].next = uVar5;
      uVar6 = cuddNextHigh(table,uVar6);
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  table->subtables[(int)uVar6].next = uVar7;
  uVar6 = cuddNextHigh(table,uVar6);
  uVar7 = uVar6;
  if (0 < iVar9) {
    do {
      uVar5 = cuddNextHigh(table,uVar7);
      table->subtables[(int)uVar7].next = uVar5;
      uVar7 = cuddNextHigh(table,uVar7);
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  table->subtables[(int)uVar7].next = uVar6;
  pDVar8 = cuddDynamicAllocNode(table);
  if (pDVar8 == (DdNode *)0x0) {
LAB_009252ac:
    iVar9 = 0;
    pMVar2 = *moves;
    while (pMVar2 != (Move *)0x0) {
      pMVar1 = pMVar2->next;
      pMVar2->y = 0;
      *(DdNode **)&pMVar2->flags = table->nextFree;
      table->nextFree = (DdNode *)*moves;
      *moves = pMVar1;
      pMVar2 = pMVar1;
    }
  }
  else {
    pDVar8->index = x_00;
    pDVar8->ref = y_00;
    *(undefined4 *)&pDVar8->next = 0;
    iVar9 = table->keys - table->isolated;
    *(int *)((long)&pDVar8->next + 4) = iVar9;
    (pDVar8->type).kids.T = (DdNode *)*moves;
    *moves = (Move *)pDVar8;
  }
  return iVar9;
}

Assistant:

static int
ddGroupMove(
  DdManager * table,
  int  x,
  int  y,
  Move ** moves)
{
    Move *move;
    int  size;
    int  i,j,xtop,xbot,xsize,ytop,ybot,ysize,newxtop;
    int  swapx = -1,swapy = -1;
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    int  initialSize,bestSize;
#endif

#ifdef DD_DEBUG
    /* We assume that x < y */
    assert(x < y);
#endif
    /* Find top, bottom, and size for the two groups. */
    xbot = x;
    xtop = table->subtables[x].next;
    xsize = xbot - xtop + 1;
    ybot = y;
    while ((unsigned) ybot < table->subtables[ybot].next)
        ybot = table->subtables[ybot].next;
    ytop = y;
    ysize = ybot - ytop + 1;

#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    initialSize = bestSize = table->keys - table->isolated;
#endif
    /* Sift the variables of the second group up through the first group */
    for (i = 1; i <= ysize; i++) {
        for (j = 1; j <= xsize; j++) {
            size = cuddSwapInPlace(table,x,y);
            if (size == 0) goto ddGroupMoveOutOfMem;
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
            if (size < bestSize)
                bestSize = size;
#endif
            swapx = x; swapy = y;
            y = x;
            x = cuddNextLow(table,y);
        }
        y = ytop + i;
        x = cuddNextLow(table,y);
    }
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    if ((bestSize < initialSize) && (bestSize < size))
        (void) fprintf(table->out,"Missed local minimum: initialSize:%d  bestSize:%d  finalSize:%d\n",initialSize,bestSize,size);
#endif

    /* fix groups */
    y = xtop; /* ytop is now where xtop used to be */
    for (i = 0; i < ysize - 1; i++) {
        table->subtables[y].next = cuddNextHigh(table,y);
        y = cuddNextHigh(table,y);
    }
    table->subtables[y].next = xtop; /* y is bottom of its group, join */
                                    /* it to top of its group */
    x = cuddNextHigh(table,y);
    newxtop = x;
    for (i = 0; i < xsize - 1; i++) {
        table->subtables[x].next = cuddNextHigh(table,x);
        x = cuddNextHigh(table,x);
    }
    table->subtables[x].next = newxtop; /* x is bottom of its group, join */
                                    /* it to top of its group */
#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,"ddGroupMove:\n");
#endif

    /* Store group move */
    move = (Move *) cuddDynamicAllocNode(table);
    if (move == NULL) goto ddGroupMoveOutOfMem;
    move->x = swapx;
    move->y = swapy;
    move->flags = MTR_DEFAULT;
    move->size = table->keys - table->isolated;
    move->next = *moves;
    *moves = move;

    return(table->keys - table->isolated);

ddGroupMoveOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }
    return(0);

}